

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_parameterization_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceCornerParameterizationQuantity::fillCoordBuffers
          (SurfaceCornerParameterizationQuantity *this,ShaderProgram *p)

{
  allocator local_41;
  undefined1 local_40 [48];
  
  std::__cxx11::string::string((string *)(local_40 + 0x10),"a_value2",&local_41);
  render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *)local_40,
             (ManagedBuffer<unsigned_int> *)
             &(this->super_SurfaceParameterizationQuantity).
              super_ParameterizationQuantity<polyscope::SurfaceParameterizationQuantity>.coords);
  (*p->_vptr_ShaderProgram[0x13])(p,local_40 + 0x10,local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void SurfaceCornerParameterizationQuantity::fillCoordBuffers(render::ShaderProgram& p) {
  p.setAttribute("a_value2", coords.getIndexedRenderAttributeBuffer(parent.triangleCornerInds));
}